

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall Compiler::compile(Compiler *this,Node *node)

{
  pointer pbVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exp;
  ofstream fout;
  
  treeTraversal(this,node,&this->TEXT);
  std::ofstream::ofstream((ostream *)&fout,(string *)&this->ASSEMBLY_FILE_NAME,_S_out);
  std::operator<<((ostream *)&fout,(string *)this);
  for (p_Var3 = (this->VARIABLES)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->VARIABLES)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((ostream *)&fout,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,": resd 1");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator<<((ostream *)&fout,"\n");
  std::operator<<((ostream *)&fout,(string *)&this->SECTION_TEXT);
  for (p_Var3 = (this->FUNCTIONS)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->FUNCTIONS)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((ostream *)&fout,"global ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator<<((ostream *)&fout,"\n");
  std::operator<<((ostream *)&fout,(string *)&this->TEXT);
  pbVar1 = (this->expressions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->expressions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)&exp,(string *)pbVar4);
    poVar2 = std::operator<<((ostream *)&fout,(string *)&exp);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&exp);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return;
}

Assistant:

void Compiler::compile(Node &node) {
    treeTraversal(node, TEXT);
    ofstream fout(ASSEMBLY_FILE_NAME);
    fout << SECTION_DATA;
    for (const auto &var : VARIABLES) {
        fout << var.first << ": resd 1" << endl;
    }
    fout << "\n";
    fout << SECTION_TEXT;
    for (auto &func : FUNCTIONS) {
        fout << "global " << func << endl;
    }
    fout << "\n";
    fout << TEXT;
    for (auto exp : expressions) {
        fout << exp << endl;
    }
    fout.close();
//    print();
}